

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

string * absl::WebSafeBase64Escape_abi_cxx11_(string_view src)

{
  uchar *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  string *dest;
  char *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::basic_string_view<char,_std::char_traits<char>_>::data
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe8);
  strings_internal::Base64EscapeInternal<std::__cxx11::string>
            (in_RDX,in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(bool)in_stack_ffffffffffffffdf,
             in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string WebSafeBase64Escape(absl::string_view src) {
  std::string dest;
  strings_internal::Base64EscapeInternal(
      reinterpret_cast<const unsigned char*>(src.data()), src.size(), &dest,
      false, strings_internal::kWebSafeBase64Chars);
  return dest;
}